

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonrpc_test.cpp
# Opt level: O2

void __thiscall json_service::json_service(json_service *this,service *srv)

{
  ostream *poVar1;
  allocator local_2a9;
  method_type local_2a8;
  binder1<json_service,_json_service_*,_int> tmp_4;
  binder2<json_service,_json_service_*,_int,_int> tmp;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  string local_30;
  
  cppcms::rpc::json_rpc_server::json_rpc_server(&this->super_json_rpc_server,srv);
  *(undefined ***)this = &PTR__json_rpc_server_00119a78;
  std::__cxx11::string::string((string *)&local_2a8,"sum",&local_2a9);
  tmp.member = (offset_in_json_service_to_subr)sum;
  tmp._16_8_ = 0;
  tmp.object = this;
  std::function<void(std::vector<cppcms::json::value,std::allocator<cppcms::json::value>>const&)>::
  function<cppcms::rpc::details::binder2<json_service,json_service*,int,int>,void>
            ((function<void(std::vector<cppcms::json::value,std::allocator<cppcms::json::value>>const&)>
              *)&tmp_4,&tmp);
  cppcms::rpc::json_rpc_server::bind(this,&local_2a8,&tmp_4,1);
  std::_Function_base::~_Function_base((_Function_base *)&tmp_4);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::__cxx11::string::string((string *)&local_2a8,"div",&local_2a9);
  tmp.member = (offset_in_json_service_to_subr)div;
  tmp._16_8_ = 0;
  tmp.object = this;
  std::function<void(std::vector<cppcms::json::value,std::allocator<cppcms::json::value>>const&)>::
  function<cppcms::rpc::details::binder2<json_service,json_service*,int,int>,void>
            ((function<void(std::vector<cppcms::json::value,std::allocator<cppcms::json::value>>const&)>
              *)&tmp_4,&tmp);
  cppcms::rpc::json_rpc_server::bind(this,&local_2a8,&tmp_4,1);
  std::_Function_base::~_Function_base((_Function_base *)&tmp_4);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::__cxx11::string::string((string *)&local_2a8,"notify",&local_2a9);
  tmp.member = (offset_in_json_service_to_subr)div;
  tmp._16_8_ = 0;
  tmp.object = this;
  std::function<void(std::vector<cppcms::json::value,std::allocator<cppcms::json::value>>const&)>::
  function<cppcms::rpc::details::binder2<json_service,json_service*,int,int>,void>
            ((function<void(std::vector<cppcms::json::value,std::allocator<cppcms::json::value>>const&)>
              *)&tmp_4,&tmp);
  cppcms::rpc::json_rpc_server::bind(this,&local_2a8,&tmp_4,2);
  std::_Function_base::~_Function_base((_Function_base *)&tmp_4);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::__cxx11::string::string((string *)&local_2a8,"both",&local_2a9);
  tmp.member = (offset_in_json_service_to_subr)both;
  tmp._16_8_ = 0;
  tmp.object = this;
  std::function<void(std::vector<cppcms::json::value,std::allocator<cppcms::json::value>>const&)>::
  function<cppcms::rpc::details::binder1<json_service,json_service*,std::__cxx11::string>,void>
            ((function<void(std::vector<cppcms::json::value,std::allocator<cppcms::json::value>>const&)>
              *)&tmp_4,
             (binder1<json_service,_json_service_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&tmp);
  cppcms::rpc::json_rpc_server::bind(this,&local_2a8,&tmp_4,0);
  std::_Function_base::~_Function_base((_Function_base *)&tmp_4);
  std::__cxx11::string::~string((string *)&local_2a8);
  poVar1 = std::operator<<((ostream *)&std::cout,"Checking bindings");
  std::endl<char,std::char_traits<char>>(poVar1);
  tmp_4.member = (offset_in_json_service_to_subr)compiles1c;
  tmp_4._16_8_ = 0;
  tmp_4.object = this;
  std::function<void(std::vector<cppcms::json::value,std::allocator<cppcms::json::value>>const&)>::
  function<cppcms::rpc::details::binder1<json_service,json_service*,int>,void>
            ((function<void(std::vector<cppcms::json::value,std::allocator<cppcms::json::value>>const&)>
              *)&local_2a8,&tmp_4);
  std::__cxx11::string::string((string *)&local_30,"[10]",(allocator *)&tmp);
  check_method(this,&local_2a8,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::_Function_base::~_Function_base(&local_2a8.super__Function_base);
  tmp_4.member = (offset_in_json_service_to_subr)compiles2c;
  tmp_4._16_8_ = 0;
  tmp_4.object = this;
  std::function<void(std::vector<cppcms::json::value,std::allocator<cppcms::json::value>>const&)>::
  function<cppcms::rpc::details::binder1<json_service,json_service*,std::__cxx11::string>,void>
            ((function<void(std::vector<cppcms::json::value,std::allocator<cppcms::json::value>>const&)>
              *)&local_2a8,
             (binder1<json_service,_json_service_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&tmp_4);
  std::__cxx11::string::string((string *)&local_50,"[\"str\"]",(allocator *)&tmp);
  check_method(this,&local_2a8,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::_Function_base::~_Function_base(&local_2a8.super__Function_base);
  tmp_4.member = (offset_in_json_service_to_subr)compiles3c;
  tmp_4._16_8_ = 0;
  tmp_4.object = this;
  std::function<void(std::vector<cppcms::json::value,std::allocator<cppcms::json::value>>const&)>::
  function<cppcms::rpc::details::binder1<json_service,json_service*,std::vector<int,std::allocator<int>>>,void>
            ((function<void(std::vector<cppcms::json::value,std::allocator<cppcms::json::value>>const&)>
              *)&local_2a8,
             (binder1<json_service,_json_service_*,_std::vector<int,_std::allocator<int>_>_> *)
             &tmp_4);
  std::__cxx11::string::string((string *)&local_70,"[[1,2]]",(allocator *)&tmp);
  check_method(this,&local_2a8,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::_Function_base::~_Function_base(&local_2a8.super__Function_base);
  tmp_4.member = (offset_in_json_service_to_subr)compiles4c;
  tmp_4._16_8_ = 0;
  tmp_4.object = this;
  std::function<void(std::vector<cppcms::json::value,std::allocator<cppcms::json::value>>const&)>::
  function<cppcms::rpc::details::binder1<json_service,json_service*,cppcms::json::value>,void>
            ((function<void(std::vector<cppcms::json::value,std::allocator<cppcms::json::value>>const&)>
              *)&local_2a8,(binder1<json_service,_json_service_*,_cppcms::json::value> *)&tmp_4);
  std::__cxx11::string::string((string *)&local_90,"[{}]",(allocator *)&tmp);
  check_method(this,&local_2a8,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::_Function_base::~_Function_base(&local_2a8.super__Function_base);
  tmp_4.member = (offset_in_json_service_to_subr)compiles5c;
  tmp_4._16_8_ = 0;
  tmp_4.object = this;
  std::function<void(std::vector<cppcms::json::value,std::allocator<cppcms::json::value>>const&)>::
  function<cppcms::rpc::details::binder1<json_service,json_service*,std::map<cppcms::string_key,cppcms::json::value,std::less<cppcms::string_key>,std::allocator<std::pair<cppcms::string_key_const,cppcms::json::value>>>>,void>
            ((function<void(std::vector<cppcms::json::value,std::allocator<cppcms::json::value>>const&)>
              *)&local_2a8,
             (binder1<json_service,_json_service_*,_std::map<cppcms::string_key,_cppcms::json::value,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_cppcms::json::value>_>_>_>
              *)&tmp_4);
  std::__cxx11::string::string((string *)&local_b0,"[{\"member\":1}]",(allocator *)&tmp);
  check_method(this,&local_2a8,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::_Function_base::~_Function_base(&local_2a8.super__Function_base);
  tmp_4.member = (offset_in_json_service_to_subr)compiles6c;
  tmp_4._16_8_ = 0;
  tmp_4.object = this;
  std::function<void(std::vector<cppcms::json::value,std::allocator<cppcms::json::value>>const&)>::
  function<cppcms::rpc::details::binder1<json_service,json_service*,std::vector<cppcms::json::value,std::allocator<cppcms::json::value>>>,void>
            ((function<void(std::vector<cppcms::json::value,std::allocator<cppcms::json::value>>const&)>
              *)&local_2a8,
             (binder1<json_service,_json_service_*,_std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>_>
              *)&tmp_4);
  std::__cxx11::string::string((string *)&local_d0,"[[1]]",(allocator *)&tmp);
  check_method(this,&local_2a8,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::_Function_base::~_Function_base(&local_2a8.super__Function_base);
  tmp_4.member = (offset_in_json_service_to_subr)compiles1cr;
  tmp_4._16_8_ = 0;
  tmp_4.object = this;
  std::function<void(std::vector<cppcms::json::value,std::allocator<cppcms::json::value>>const&)>::
  function<cppcms::rpc::details::binder1<json_service,json_service*,int_const&>,void>
            ((function<void(std::vector<cppcms::json::value,std::allocator<cppcms::json::value>>const&)>
              *)&local_2a8,(binder1<json_service,_json_service_*,_const_int_&> *)&tmp_4);
  std::__cxx11::string::string((string *)&local_f0,"[10]",(allocator *)&tmp);
  check_method(this,&local_2a8,&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::_Function_base::~_Function_base(&local_2a8.super__Function_base);
  tmp_4.member = (offset_in_json_service_to_subr)compiles2cr;
  tmp_4._16_8_ = 0;
  tmp_4.object = this;
  std::function<void(std::vector<cppcms::json::value,std::allocator<cppcms::json::value>>const&)>::
  function<cppcms::rpc::details::binder1<json_service,json_service*,std::__cxx11::string_const&>,void>
            ((function<void(std::vector<cppcms::json::value,std::allocator<cppcms::json::value>>const&)>
              *)&local_2a8,
             (binder1<json_service,_json_service_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              *)&tmp_4);
  std::__cxx11::string::string((string *)&local_110,"[\"str\"]",(allocator *)&tmp);
  check_method(this,&local_2a8,&local_110);
  std::__cxx11::string::~string((string *)&local_110);
  std::_Function_base::~_Function_base(&local_2a8.super__Function_base);
  tmp_4.member = (offset_in_json_service_to_subr)compiles3cr;
  tmp_4._16_8_ = 0;
  tmp_4.object = this;
  std::function<void(std::vector<cppcms::json::value,std::allocator<cppcms::json::value>>const&)>::
  function<cppcms::rpc::details::binder1<json_service,json_service*,std::vector<int,std::allocator<int>>const&>,void>
            ((function<void(std::vector<cppcms::json::value,std::allocator<cppcms::json::value>>const&)>
              *)&local_2a8,
             (binder1<json_service,_json_service_*,_const_std::vector<int,_std::allocator<int>_>_&>
              *)&tmp_4);
  std::__cxx11::string::string((string *)&local_130,"[[1,2]]",(allocator *)&tmp);
  check_method(this,&local_2a8,&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  std::_Function_base::~_Function_base(&local_2a8.super__Function_base);
  tmp_4.member = (offset_in_json_service_to_subr)compiles4cr;
  tmp_4._16_8_ = 0;
  tmp_4.object = this;
  std::function<void(std::vector<cppcms::json::value,std::allocator<cppcms::json::value>>const&)>::
  function<cppcms::rpc::details::binder1<json_service,json_service*,cppcms::json::value_const&>,void>
            ((function<void(std::vector<cppcms::json::value,std::allocator<cppcms::json::value>>const&)>
              *)&local_2a8,
             (binder1<json_service,_json_service_*,_const_cppcms::json::value_&> *)&tmp_4);
  std::__cxx11::string::string((string *)&local_150,"[{}]",(allocator *)&tmp);
  check_method(this,&local_2a8,&local_150);
  std::__cxx11::string::~string((string *)&local_150);
  std::_Function_base::~_Function_base(&local_2a8.super__Function_base);
  tmp_4.member = (offset_in_json_service_to_subr)compiles5cr;
  tmp_4._16_8_ = 0;
  tmp_4.object = this;
  std::function<void(std::vector<cppcms::json::value,std::allocator<cppcms::json::value>>const&)>::
  function<cppcms::rpc::details::binder1<json_service,json_service*,std::map<cppcms::string_key,cppcms::json::value,std::less<cppcms::string_key>,std::allocator<std::pair<cppcms::string_key_const,cppcms::json::value>>>const&>,void>
            ((function<void(std::vector<cppcms::json::value,std::allocator<cppcms::json::value>>const&)>
              *)&local_2a8,
             (binder1<json_service,_json_service_*,_const_std::map<cppcms::string_key,_cppcms::json::value,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_cppcms::json::value>_>_>_&>
              *)&tmp_4);
  std::__cxx11::string::string((string *)&local_170,"[{\"member\":1}]",(allocator *)&tmp);
  check_method(this,&local_2a8,&local_170);
  std::__cxx11::string::~string((string *)&local_170);
  std::_Function_base::~_Function_base(&local_2a8.super__Function_base);
  tmp_4.member = (offset_in_json_service_to_subr)compiles6cr;
  tmp_4._16_8_ = 0;
  tmp_4.object = this;
  std::function<void(std::vector<cppcms::json::value,std::allocator<cppcms::json::value>>const&)>::
  function<cppcms::rpc::details::binder1<json_service,json_service*,std::vector<cppcms::json::value,std::allocator<cppcms::json::value>>const&>,void>
            ((function<void(std::vector<cppcms::json::value,std::allocator<cppcms::json::value>>const&)>
              *)&local_2a8,
             (binder1<json_service,_json_service_*,_const_std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>_&>
              *)&tmp_4);
  std::__cxx11::string::string((string *)&local_190,"[[1]]",(allocator *)&tmp);
  check_method(this,&local_2a8,&local_190);
  std::__cxx11::string::~string((string *)&local_190);
  std::_Function_base::~_Function_base(&local_2a8.super__Function_base);
  tmp_4.member = (offset_in_json_service_to_subr)compiles1v;
  tmp_4._16_8_ = 0;
  tmp_4.object = this;
  std::function<void(std::vector<cppcms::json::value,std::allocator<cppcms::json::value>>const&)>::
  function<cppcms::rpc::details::binder1<json_service,json_service*,int>,void>
            ((function<void(std::vector<cppcms::json::value,std::allocator<cppcms::json::value>>const&)>
              *)&local_2a8,&tmp_4);
  std::__cxx11::string::string((string *)&local_1b0,"[10]",(allocator *)&tmp);
  check_method(this,&local_2a8,&local_1b0);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::_Function_base::~_Function_base(&local_2a8.super__Function_base);
  tmp_4.member = (offset_in_json_service_to_subr)compiles2v;
  tmp_4._16_8_ = 0;
  tmp_4.object = this;
  std::function<void(std::vector<cppcms::json::value,std::allocator<cppcms::json::value>>const&)>::
  function<cppcms::rpc::details::binder1<json_service,json_service*,std::__cxx11::string>,void>
            ((function<void(std::vector<cppcms::json::value,std::allocator<cppcms::json::value>>const&)>
              *)&local_2a8,
             (binder1<json_service,_json_service_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&tmp_4);
  std::__cxx11::string::string((string *)&local_1d0,"[\"str\"]",(allocator *)&tmp);
  check_method(this,&local_2a8,&local_1d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::_Function_base::~_Function_base(&local_2a8.super__Function_base);
  tmp_4.member = (offset_in_json_service_to_subr)compiles3v;
  tmp_4._16_8_ = 0;
  tmp_4.object = this;
  std::function<void(std::vector<cppcms::json::value,std::allocator<cppcms::json::value>>const&)>::
  function<cppcms::rpc::details::binder1<json_service,json_service*,std::vector<int,std::allocator<int>>>,void>
            ((function<void(std::vector<cppcms::json::value,std::allocator<cppcms::json::value>>const&)>
              *)&local_2a8,
             (binder1<json_service,_json_service_*,_std::vector<int,_std::allocator<int>_>_> *)
             &tmp_4);
  std::__cxx11::string::string((string *)&local_1f0,"[[1,2]]",(allocator *)&tmp);
  check_method(this,&local_2a8,&local_1f0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::_Function_base::~_Function_base(&local_2a8.super__Function_base);
  tmp_4.member = (offset_in_json_service_to_subr)compiles4v;
  tmp_4._16_8_ = 0;
  tmp_4.object = this;
  std::function<void(std::vector<cppcms::json::value,std::allocator<cppcms::json::value>>const&)>::
  function<cppcms::rpc::details::binder1<json_service,json_service*,cppcms::json::value>,void>
            ((function<void(std::vector<cppcms::json::value,std::allocator<cppcms::json::value>>const&)>
              *)&local_2a8,(binder1<json_service,_json_service_*,_cppcms::json::value> *)&tmp_4);
  std::__cxx11::string::string((string *)&local_210,"[{}]",(allocator *)&tmp);
  check_method(this,&local_2a8,&local_210);
  std::__cxx11::string::~string((string *)&local_210);
  std::_Function_base::~_Function_base(&local_2a8.super__Function_base);
  tmp_4.member = (offset_in_json_service_to_subr)compiles5v;
  tmp_4._16_8_ = 0;
  tmp_4.object = this;
  std::function<void(std::vector<cppcms::json::value,std::allocator<cppcms::json::value>>const&)>::
  function<cppcms::rpc::details::binder1<json_service,json_service*,std::map<cppcms::string_key,cppcms::json::value,std::less<cppcms::string_key>,std::allocator<std::pair<cppcms::string_key_const,cppcms::json::value>>>>,void>
            ((function<void(std::vector<cppcms::json::value,std::allocator<cppcms::json::value>>const&)>
              *)&local_2a8,
             (binder1<json_service,_json_service_*,_std::map<cppcms::string_key,_cppcms::json::value,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_cppcms::json::value>_>_>_>
              *)&tmp_4);
  std::__cxx11::string::string((string *)&local_230,"[{\"member\":1}]",(allocator *)&tmp);
  check_method(this,&local_2a8,&local_230);
  std::__cxx11::string::~string((string *)&local_230);
  std::_Function_base::~_Function_base(&local_2a8.super__Function_base);
  tmp_4.member = (offset_in_json_service_to_subr)compiles6v;
  tmp_4._16_8_ = 0;
  tmp_4.object = this;
  std::function<void(std::vector<cppcms::json::value,std::allocator<cppcms::json::value>>const&)>::
  function<cppcms::rpc::details::binder1<json_service,json_service*,std::vector<cppcms::json::value,std::allocator<cppcms::json::value>>>,void>
            ((function<void(std::vector<cppcms::json::value,std::allocator<cppcms::json::value>>const&)>
              *)&local_2a8,
             (binder1<json_service,_json_service_*,_std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>_>
              *)&tmp_4);
  std::__cxx11::string::string((string *)&local_250,"[[1]]",(allocator *)&tmp);
  check_method(this,&local_2a8,&local_250);
  std::__cxx11::string::~string((string *)&local_250);
  std::_Function_base::~_Function_base(&local_2a8.super__Function_base);
  poVar1 = std::operator<<((ostream *)&std::cout,"Ok");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::string((string *)&local_2a8,"{}",(allocator *)&tmp_4);
  cppcms::rpc::json_rpc_server::smd_raw((string *)this);
  std::__cxx11::string::~string((string *)&local_2a8);
  return;
}

Assistant:

json_service(cppcms::service &srv) : cppcms::rpc::json_rpc_server(srv)
	{
		bind("sum",cppcms::rpc::json_method(&json_service::sum,this),method_role);
		bind("div",cppcms::rpc::json_method(&json_service::div,this),method_role);
		bind("notify",cppcms::rpc::json_method(&json_service::div,this),notification_role);
		bind("both",cppcms::rpc::json_method(&json_service::both,this));

		std::cout << "Checking bindings" << std::endl;
		check_method(cppcms::rpc::json_method(&json_service::compiles1c,this),"[10]");
		check_method(cppcms::rpc::json_method(&json_service::compiles2c,this),"[\"str\"]");
		check_method(cppcms::rpc::json_method(&json_service::compiles3c,this),"[[1,2]]");
		check_method(cppcms::rpc::json_method(&json_service::compiles4c,this),"[{}]");
		check_method(cppcms::rpc::json_method(&json_service::compiles5c,this),"[{\"member\":1}]");
		check_method(cppcms::rpc::json_method(&json_service::compiles6c,this),"[[1]]");
		
		check_method(cppcms::rpc::json_method(&json_service::compiles1cr,this),"[10]");
		check_method(cppcms::rpc::json_method(&json_service::compiles2cr,this),"[\"str\"]");
		check_method(cppcms::rpc::json_method(&json_service::compiles3cr,this),"[[1,2]]");
		check_method(cppcms::rpc::json_method(&json_service::compiles4cr,this),"[{}]");
		check_method(cppcms::rpc::json_method(&json_service::compiles5cr,this),"[{\"member\":1}]");
		check_method(cppcms::rpc::json_method(&json_service::compiles6cr,this),"[[1]]");

		check_method(cppcms::rpc::json_method(&json_service::compiles1v,this),"[10]");
		check_method(cppcms::rpc::json_method(&json_service::compiles2v,this),"[\"str\"]");
		check_method(cppcms::rpc::json_method(&json_service::compiles3v,this),"[[1,2]]");
		check_method(cppcms::rpc::json_method(&json_service::compiles4v,this),"[{}]");
		check_method(cppcms::rpc::json_method(&json_service::compiles5v,this),"[{\"member\":1}]");
		check_method(cppcms::rpc::json_method(&json_service::compiles6v,this),"[[1]]");

		std::cout << "Ok" << std::endl;

		smd_raw("{}");
	}